

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::raii_casemap::raii_casemap(raii_casemap *this,string *locale_id)

{
  undefined8 uVar1;
  long lVar2;
  string *in_RDI;
  UErrorCode err;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  allocator local_39;
  string local_38 [36];
  undefined4 local_14 [5];
  
  *(long *)in_RDI = 0;
  local_14[0] = 0;
  uVar1 = std::__cxx11::string::c_str();
  lVar2 = ucasemap_open_70(uVar1,0,local_14);
  *(long *)in_RDI = lVar2;
  check_and_throw_icu_error(U_ZERO_ERROR);
  if (*(long *)in_RDI == 0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Failed to create UCaseMap",&local_39);
    runtime_error::runtime_error((runtime_error *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),in_RDI);
    __cxa_throw(uVar1,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  return;
}

Assistant:

raii_casemap(std::string const &locale_id) :
            map_(0)
        {
            UErrorCode err=U_ZERO_ERROR;
            map_ = ucasemap_open(locale_id.c_str(),0,&err);
            check_and_throw_icu_error(err);
            if(!map_)
                throw booster::runtime_error("Failed to create UCaseMap");
        }